

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<VkSpecParser::TypedName*,long_long>
               (TypedName *first,longlong n,TypedName *d_first)

{
  TypedName *pTVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  TypedName *pTVar5;
  TypedName *pTVar6;
  long in_FS_OFFSET;
  Destructor local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar1 = d_first + n;
  pTVar6 = first;
  pTVar5 = pTVar1;
  if (first < pTVar1) {
    pTVar6 = pTVar1;
    pTVar5 = first;
  }
  local_30.intermediate = d_first;
  if (pTVar5 != d_first) {
    do {
      pDVar2 = (first->name).d.d;
      (first->name).d.d = (Data *)0x0;
      ((local_30.intermediate)->name).d.d = pDVar2;
      pcVar3 = (first->name).d.ptr;
      (first->name).d.ptr = (char16_t *)0x0;
      ((local_30.intermediate)->name).d.ptr = pcVar3;
      qVar4 = (first->name).d.size;
      (first->name).d.size = 0;
      ((local_30.intermediate)->name).d.size = qVar4;
      pDVar2 = (first->type).d.d;
      (first->type).d.d = (Data *)0x0;
      ((local_30.intermediate)->type).d.d = pDVar2;
      pcVar3 = (first->type).d.ptr;
      (first->type).d.ptr = (char16_t *)0x0;
      ((local_30.intermediate)->type).d.ptr = pcVar3;
      qVar4 = (first->type).d.size;
      (first->type).d.size = 0;
      ((local_30.intermediate)->type).d.size = qVar4;
      pDVar2 = (first->typeSuffix).d.d;
      (first->typeSuffix).d.d = (Data *)0x0;
      ((local_30.intermediate)->typeSuffix).d.d = pDVar2;
      pcVar3 = (first->typeSuffix).d.ptr;
      (first->typeSuffix).d.ptr = (char16_t *)0x0;
      ((local_30.intermediate)->typeSuffix).d.ptr = pcVar3;
      qVar4 = (first->typeSuffix).d.size;
      (first->typeSuffix).d.size = 0;
      ((local_30.intermediate)->typeSuffix).d.size = qVar4;
      local_30.intermediate = local_30.intermediate + 1;
      first = first + 1;
    } while (local_30.intermediate != pTVar5);
  }
  local_30.iter = &local_30.end;
  for (pTVar5 = local_30.intermediate; local_30.end = d_first, pTVar5 != pTVar1; pTVar5 = pTVar5 + 1
      ) {
    pDVar2 = (pTVar5->name).d.d;
    (pTVar5->name).d.d = (first->name).d.d;
    (first->name).d.d = pDVar2;
    pcVar3 = (pTVar5->name).d.ptr;
    (pTVar5->name).d.ptr = (first->name).d.ptr;
    (first->name).d.ptr = pcVar3;
    qVar4 = (pTVar5->name).d.size;
    (pTVar5->name).d.size = (first->name).d.size;
    (first->name).d.size = qVar4;
    pDVar2 = (pTVar5->type).d.d;
    (pTVar5->type).d.d = (first->type).d.d;
    (first->type).d.d = pDVar2;
    pcVar3 = (pTVar5->type).d.ptr;
    (pTVar5->type).d.ptr = (first->type).d.ptr;
    (first->type).d.ptr = pcVar3;
    qVar4 = (pTVar5->type).d.size;
    (pTVar5->type).d.size = (first->type).d.size;
    (first->type).d.size = qVar4;
    pDVar2 = (pTVar5->typeSuffix).d.d;
    (pTVar5->typeSuffix).d.d = (first->typeSuffix).d.d;
    (first->typeSuffix).d.d = pDVar2;
    pcVar3 = (pTVar5->typeSuffix).d.ptr;
    (pTVar5->typeSuffix).d.ptr = (first->typeSuffix).d.ptr;
    (first->typeSuffix).d.ptr = pcVar3;
    qVar4 = (pTVar5->typeSuffix).d.size;
    (pTVar5->typeSuffix).d.size = (first->typeSuffix).d.size;
    (first->typeSuffix).d.size = qVar4;
    first = first + 1;
  }
  while (first != pTVar6) {
    pDVar2 = first[-1].typeSuffix.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].typeSuffix.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = first[-1].type.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].type.d.d)->super_QArrayData,2,0x10);
      }
    }
    first = first + -1;
    pDVar2 = (first->name).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((first->name).d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<VkSpecParser::TypedName_*,_long_long>::Destructor::~Destructor
            (&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}